

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O0

void __thiscall CFlow::DbgRender(CFlow *this)

{
  IGraphics *pIVar1;
  IGraphics *pIVar2;
  int iVar3;
  long in_FS_OFFSET;
  vector2_base<float> vVar4;
  long *plVar5;
  vec2 Vel;
  int x;
  int y;
  int NumItems;
  CFlow *this_local;
  CLineItem local_4020;
  vec2 Pos;
  CLineItem Array [1024];
  long local_8;
  
  Array[0x300].m_X1 = 0.0;
  Array[0x300].m_Y1 = 0.0;
  Array[0x200].m_X1 = 0.0;
  Array[0x200].m_Y1 = 0.0;
  Array[0x100].m_X1 = 0.0;
  Array[0x100].m_Y1 = 0.0;
  Array[0].m_X1 = 0.0;
  Array[0].m_Y1 = 0.0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pCells != (CCell *)0x0) {
    plVar5 = &local_8;
    pIVar2 = (IGraphics *)Array;
    do {
      pIVar1 = pIVar2;
      IGraphics::CLineItem::CLineItem((CLineItem *)pIVar1);
      pIVar2 = (IGraphics *)&pIVar1->m_ScreenWidth;
    } while (pIVar2 != (IGraphics *)plVar5);
    NumItems = 0;
    CComponent::Graphics((CComponent *)0x1627e2);
    IGraphics::TextureClear(pIVar1);
    pIVar1 = CComponent::Graphics((CComponent *)0x1627f4);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x14])();
    for (y = 0; y < this->m_Height; y = y + 1) {
      for (x = 0; x < this->m_Width; x = x + 1) {
        vector2_base<float>::vector2_base
                  (&Pos,(float)(x * this->m_Spacing),(float)(y * this->m_Spacing));
        vVar4 = vector2_base<float>::operator*
                          ((vector2_base<float> *)pIVar2,(float)((ulong)plVar5 >> 0x20));
        Vel.field_0 = vVar4.field_0;
        Vel.field_1 = vVar4.field_1;
        IGraphics::CLineItem::CLineItem
                  (&local_4020,Pos.field_0.x,Pos.field_1.y,Pos.field_0.x + Vel.field_0.x,
                   Pos.field_1.y + Vel.field_1.y);
        iVar3 = NumItems + 1;
        Array[NumItems].m_X0 = local_4020.m_X0;
        Array[NumItems].m_Y0 = local_4020.m_Y0;
        Array[NumItems].m_X1 = local_4020.m_X1;
        Array[NumItems].m_Y1 = local_4020.m_Y1;
        NumItems = iVar3;
        if (iVar3 == 0x400) {
          pIVar1 = CComponent::Graphics((CComponent *)0x1628fe);
          (*(pIVar1->super_IInterface)._vptr_IInterface[0x16])(pIVar1,Array,0x400);
          NumItems = 0;
        }
      }
    }
    if (NumItems != 0) {
      pIVar2 = CComponent::Graphics((CComponent *)0x162951);
      (*(pIVar2->super_IInterface)._vptr_IInterface[0x16])(pIVar2,Array,(ulong)(uint)NumItems);
    }
    pIVar2 = CComponent::Graphics((CComponent *)0x162970);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x15])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CFlow::DbgRender()
{
	if(!m_pCells)
		return;

	IGraphics::CLineItem Array[1024];
	int NumItems = 0;
	Graphics()->TextureClear();
	Graphics()->LinesBegin();
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			vec2 Pos(x*m_Spacing, y*m_Spacing);
			vec2 Vel = m_pCells[y*m_Width+x].m_Vel * 0.01f;
			Array[NumItems++] = IGraphics::CLineItem(Pos.x, Pos.y, Pos.x+Vel.x, Pos.y+Vel.y);
			if(NumItems == 1024)
			{
				Graphics()->LinesDraw(Array, 1024);
				NumItems = 0;
			}
		}

	if(NumItems)
		Graphics()->LinesDraw(Array, NumItems);
	Graphics()->LinesEnd();
}